

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gss.c
# Opt level: O2

ssh_gss_liblist * ssh_gss_setup(Conf *conf)

{
  int iVar1;
  ssh_gss_liblist *psVar2;
  ssh_gss_library *psVar3;
  void *pvVar4;
  Filename *pFVar5;
  char *pcVar6;
  
  psVar2 = (ssh_gss_liblist *)safemalloc(1,0x10,0);
  psVar3 = (ssh_gss_library *)safemalloc(4,200,0);
  psVar2->libraries = psVar3;
  psVar2->nlibraries = 0;
  pvVar4 = (void *)dlopen("libgssapi.so.2",1);
  if (pvVar4 != (void *)0x0) {
    iVar1 = psVar2->nlibraries;
    psVar2->nlibraries = iVar1 + 1;
    gss_init(psVar2->libraries + iVar1,pvVar4,0,"Using GSSAPI from libgssapi.so.2");
  }
  pvVar4 = (void *)dlopen("libgssapi_krb5.so.2",1);
  if (pvVar4 != (void *)0x0) {
    iVar1 = psVar2->nlibraries;
    psVar2->nlibraries = iVar1 + 1;
    gss_init(psVar2->libraries + iVar1,pvVar4,1,"Using GSSAPI from libgssapi_krb5.so.2");
  }
  pvVar4 = (void *)dlopen("libgss.so.1",1);
  if (pvVar4 != (void *)0x0) {
    iVar1 = psVar2->nlibraries;
    psVar2->nlibraries = iVar1 + 1;
    gss_init(psVar2->libraries + iVar1,pvVar4,2,"Using GSSAPI from libgss.so.1");
  }
  pFVar5 = conf_get_filename(conf,0x2f);
  pcVar6 = pFVar5->path;
  if (*pcVar6 != '\0') {
    pvVar4 = (void *)dlopen(pcVar6,1);
    if (pvVar4 != (void *)0x0) {
      iVar1 = psVar2->nlibraries;
      psVar2->nlibraries = iVar1 + 1;
      psVar3 = psVar2->libraries;
      pcVar6 = dupprintf("Using GSSAPI from user-specified library \'%s\'",pcVar6);
      gss_init(psVar3 + iVar1,pvVar4,3,pcVar6);
    }
  }
  return psVar2;
}

Assistant:

struct ssh_gss_liblist *ssh_gss_setup(Conf *conf)
{
    void *gsslib;
    char *gsspath;
    struct ssh_gss_liblist *list = snew(struct ssh_gss_liblist);

    list->libraries = snewn(4, struct ssh_gss_library);
    list->nlibraries = 0;

    /* Heimdal's GSSAPI Library */
    if ((gsslib = dlopen("libgssapi.so.2", RTLD_LAZY)) != NULL)
        gss_init(&list->libraries[list->nlibraries++], gsslib,
                 0, "Using GSSAPI from libgssapi.so.2");

    /* MIT Kerberos's GSSAPI Library */
    if ((gsslib = dlopen("libgssapi_krb5.so.2", RTLD_LAZY)) != NULL)
        gss_init(&list->libraries[list->nlibraries++], gsslib,
                 1, "Using GSSAPI from libgssapi_krb5.so.2");

    /* Sun's GSSAPI Library */
    if ((gsslib = dlopen("libgss.so.1", RTLD_LAZY)) != NULL)
        gss_init(&list->libraries[list->nlibraries++], gsslib,
                 2, "Using GSSAPI from libgss.so.1");

    /* User-specified GSSAPI library */
    gsspath = conf_get_filename(conf, CONF_ssh_gss_custom)->path;
    if (*gsspath && (gsslib = dlopen(gsspath, RTLD_LAZY)) != NULL)
        gss_init(&list->libraries[list->nlibraries++], gsslib,
                 3, dupprintf("Using GSSAPI from user-specified"
                              " library '%s'", gsspath));

    return list;
}